

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Voxelizer.cpp
# Opt level: O2

void __thiscall Voxelizer::create_render_pass(Voxelizer *this,shared_ptr<myvk::Device> *device)

{
  undefined1 auStack_a8 [24];
  element_type *peStack_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  VkRenderPass pVStack_80;
  undefined8 local_78;
  VkSubpassDescription *pVStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  VkSubpassDescription local_58;
  
  pVStack_70 = &local_58;
  local_58.pDepthStencilAttachment = (VkAttachmentReference *)0x0;
  local_58.preserveAttachmentCount = 0;
  local_58._60_4_ = 0;
  local_58.pColorAttachments = (VkAttachmentReference *)0x0;
  local_58.pResolveAttachments = (VkAttachmentReference *)0x0;
  local_58.pPreserveAttachments = (uint32_t *)0x0;
  peStack_90 = (element_type *)0x0;
  local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68 = 0;
  uStack_60 = 0;
  auStack_a8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x26;
  pVStack_80 = (VkRenderPass)0x0;
  local_58.pInputAttachments = (VkAttachmentReference *)0x0;
  local_58.colorAttachmentCount = 0;
  local_58._28_4_ = 0;
  local_58.flags = 0;
  local_58.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  local_58.inputAttachmentCount = 0;
  local_58._12_4_ = 0;
  local_78 = 1;
  myvk::RenderPass::Create
            ((RenderPass *)auStack_a8,device,(VkRenderPassCreateInfo *)(auStack_a8 + 0x10));
  std::__shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_render_pass).super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>
             ,(__shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2> *)auStack_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_a8 + 8));
  return;
}

Assistant:

void Voxelizer::create_render_pass(const std::shared_ptr<myvk::Device> &device) {
	VkSubpassDescription subpass = {};
	subpass.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
	subpass.colorAttachmentCount = 0;
	subpass.pColorAttachments = nullptr;
	subpass.pDepthStencilAttachment = nullptr;

	VkRenderPassCreateInfo render_pass_info = {};
	render_pass_info.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
	render_pass_info.attachmentCount = 0;
	render_pass_info.pAttachments = nullptr;
	render_pass_info.subpassCount = 1;
	render_pass_info.pSubpasses = &subpass;
	render_pass_info.dependencyCount = 0;
	render_pass_info.pDependencies = nullptr;

	m_render_pass = myvk::RenderPass::Create(device, render_pass_info);
}